

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qplaintexteditsearchwidget.cpp
# Opt level: O1

bool __thiscall QPlainTextEditSearchWidget::doReplace(QPlainTextEditSearchWidget *this,bool forAll)

{
  char cVar1;
  bool bVar2;
  int iVar3;
  MoveMode MVar4;
  bool bVar5;
  QTextCursor cursor;
  QString text;
  QString QStack_88;
  QString local_68;
  QArrayData *local_48 [3];
  QArrayData *local_30;
  long local_20;
  
  cVar1 = QPlainTextEdit::isReadOnly();
  if (cVar1 == '\0') {
    QPlainTextEdit::textCursor();
    if (forAll) {
      bVar5 = false;
    }
    else {
      QTextCursor::selectedText();
      bVar5 = local_20 == 0;
      if (local_30 != (QArrayData *)0x0) {
        LOCK();
        (local_30->ref_)._q_value.super___atomic_base<int>._M_i =
             (local_30->ref_)._q_value.super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if ((local_30->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate(local_30,2,8);
        }
      }
    }
    if (bVar5 == false) {
      iVar3 = QComboBox::currentIndex();
      if (iVar3 == 2) {
        QTextCursor::selectedText();
        QLineEdit::text();
        QRegularExpression::QRegularExpression((QRegularExpression *)&local_68,local_48,0);
        QLineEdit::text();
        QString::replace((QRegularExpression *)&QStack_88.d.ptr,&local_68);
        if ((QArrayData *)local_68.d.ptr != (QArrayData *)0x0) {
          LOCK();
          (((QBasicAtomicInt *)local_68.d.ptr)->_q_value).super___atomic_base<int>._M_i =
               (((QBasicAtomicInt *)local_68.d.ptr)->_q_value).super___atomic_base<int>._M_i + -1;
          UNLOCK();
          if ((((QBasicAtomicInt *)local_68.d.ptr)->_q_value).super___atomic_base<int>._M_i == 0) {
            QArrayData::deallocate((QArrayData *)local_68.d.ptr,2,8);
          }
        }
        QRegularExpression::~QRegularExpression((QRegularExpression *)&local_68);
        if (local_48[0] != (QArrayData *)0x0) {
          LOCK();
          (local_48[0]->ref_)._q_value.super___atomic_base<int>._M_i =
               (local_48[0]->ref_)._q_value.super___atomic_base<int>._M_i + -1;
          UNLOCK();
          if ((local_48[0]->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
            QArrayData::deallocate(local_48[0],2,8);
          }
        }
        QTextCursor::insertText(&QStack_88);
      }
      else {
        QLineEdit::text();
        QTextCursor::insertText(&QStack_88);
      }
      if ((QArrayData *)QStack_88.d.ptr != (QArrayData *)0x0) {
        LOCK();
        (((QBasicAtomicInt *)QStack_88.d.ptr)->_q_value).super___atomic_base<int>._M_i =
             (((QBasicAtomicInt *)QStack_88.d.ptr)->_q_value).super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if ((((QBasicAtomicInt *)QStack_88.d.ptr)->_q_value).super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate((QArrayData *)QStack_88.d.ptr,2,8);
        }
      }
      if (!forAll) {
        MVar4 = QTextCursor::position();
        bVar2 = doSearch(this,true,true,true);
        if (!bVar2) {
          QTextCursor::setPosition((int)&QStack_88,MVar4);
          QPlainTextEdit::setTextCursor(*(QTextCursor **)(this + 0x88));
        }
      }
    }
    bVar5 = (bool)(bVar5 ^ 1);
    QTextCursor::~QTextCursor((QTextCursor *)&QStack_88);
  }
  else {
    bVar5 = false;
  }
  return bVar5;
}

Assistant:

bool QPlainTextEditSearchWidget::doReplace(bool forAll) {
    if (_textEdit->isReadOnly()) {
        return false;
    }

    QTextCursor cursor = _textEdit->textCursor();

    if (!forAll && cursor.selectedText().isEmpty()) {
        return false;
    }

    const int searchMode = ui->modeComboBox->currentIndex();
    if (searchMode == RegularExpressionMode) {
        QString text = cursor.selectedText();
        text.replace(QRegularExpression(ui->searchLineEdit->text()),
                     ui->replaceLineEdit->text());
        cursor.insertText(text);
    } else {
        cursor.insertText(ui->replaceLineEdit->text());
    }

    if (!forAll) {
        const int position = cursor.position();

        if (!doSearch(true)) {
            // restore the last cursor position if text wasn't found any more
            cursor.setPosition(position);
            _textEdit->setTextCursor(cursor);
        }
    }

    return true;
}